

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

void CCEXP::AddVal<short>(CCEXP *obj,char *matname,short val)

{
  size_t sel_00;
  unsigned_long uVar1;
  char *pcVar2;
  char *local_40;
  char *local_38;
  size_t sel;
  short val_local;
  char *matname_local;
  CCEXP *obj_local;
  
  obj->ErrorId = 0;
  sel_00 = CCEXP::getTableIndexByName(obj,matname);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (sel_00 == uVar1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_40 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
        ;
      }
      else {
        local_40 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
        local_40 = local_40 + 1;
      }
      local_38 = local_40;
    }
    else {
      local_38 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
      local_38 = local_38 + 1;
    }
    CECS::RecError((CECS *)CCEXPECS,-9999,1,local_38,0x2b5,
                   "[%s]: AddVal():: Failed to find table with name [%s]!",obj->SavingFile,matname);
  }
  else {
    AddVal<short>(obj,sel_00,val);
  }
  return;
}

Assistant:

void AddVal(
	CCEXP &obj, const char* matname, T val
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERR(CCEXPECS,sel == MAXSIZE_T,"[%s]: AddVal():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	AddVal(obj, sel, val);
}